

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O1

void cs_impl::hash_set_cs_ext::insert(hash_set *set,var *val)

{
  any *key;
  any aStack_38;
  any local_30;
  hash_set *local_28;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>::iterator,_bool>
  local_20;
  
  local_30.mDat = val->mDat;
  if (local_30.mDat != (proxy *)0x0) {
    (local_30.mDat)->refcount = (local_30.mDat)->refcount + 1;
  }
  cs::copy((EVP_PKEY_CTX *)&aStack_38,(EVP_PKEY_CTX *)&local_30);
  local_28 = set;
  phmap::priv::
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>
  ::EmplaceDecomposable::operator()(&local_20,&local_28,&aStack_38,&aStack_38);
  any::recycle(&aStack_38);
  any::recycle(&local_30);
  return;
}

Assistant:

void insert(hash_set &set, const var &val)
		{
			set.insert(copy(val));
		}